

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<slang::ast::DriverVisitor&>
          (ReplicatedAssignmentPatternExpression *this,DriverVisitor *visitor)

{
  Expression::visit<slang::ast::DriverVisitor&>(this->count_,visitor);
  AssignmentPatternExpressionBase::visitExprs<slang::ast::DriverVisitor&>
            (&this->super_AssignmentPatternExpressionBase,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }